

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::detail::
eval_function<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (detail *this,Dispatch_Engine *t_ss,
          AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *t_param_names,Function_Params *t_vals,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *t_locals,bool has_this_capture)

{
  pointer pbVar1;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *pAVar2;
  bool bVar3;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Rb_tree_node_base *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Boxed_Value BVar9;
  Stack_Push_Pop tpp;
  Dispatch_State state;
  allocator<char> local_c9;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *local_c8;
  Stack_Push_Pop local_c0;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *local_b8;
  Function_Params *local_b0;
  ulong local_a8;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  Dispatch_State local_50;
  
  local_c8 = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)this;
  local_b8 = t_node;
  chaiscript::detail::Dispatch_State::Dispatch_State(&local_50,t_ss);
  local_b0 = t_vals;
  local_70._M_dataplus._M_p = (pointer)t_ss;
  local_70._M_string_length = (size_type)&local_50;
  local_70.field_2._M_allocated_capacity = (size_type)t_vals;
  p_Var4 = (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
           eval_function<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
           anon_class_24_3_184ec0ec::operator()((anon_class_24_3_184ec0ec *)&local_70);
  local_c0.m_ds = &local_50;
  chaiscript::detail::Stack_Holder::push_stack(local_50.m_stack_holder._M_data);
  if (p_Var4 != (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)0x0 &&
      !has_this_capture) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"this",&local_c9);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,p_Var4);
    chaiscript::detail::Dispatch_State::add_object(&local_50,&local_70,(Boxed_Value *)&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (t_locals !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       *)0x0) {
    for (p_Var5 = (t_locals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(t_locals->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var5 + 2));
      chaiscript::detail::Dispatch_State::add_object
                (&local_50,(string *)(p_Var5 + 1),(Boxed_Value *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    }
  }
  lVar7 = 0;
  lVar6 = 0;
  for (uVar8 = 0; pAVar2 = local_c8,
      pbVar1 = (t_param_names->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(t_param_names->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar8 = uVar8 + 1) {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar7),"this");
    if (!bVar3) {
      pbVar1 = (t_param_names->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_a8 = uVar8;
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a0,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(local_b0->m_begin->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar6));
      chaiscript::detail::Dispatch_State::add_object
                (&local_50,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7),
                 (Boxed_Value *)&local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      uVar8 = local_a8;
    }
    lVar6 = lVar6 + 0x10;
    lVar7 = lVar7 + 0x20;
  }
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            (local_c8,(Dispatch_State *)local_b8);
  Stack_Push_Pop::~Stack_Push_Pop(&local_c0);
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)pAVar2;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_function(chaiscript::detail::Dispatch_Engine &t_ss,
                                const AST_Node_Impl<T> &t_node,
                                const std::vector<std::string> &t_param_names,
                                const Function_Params &t_vals,
                                const std::map<std::string, Boxed_Value> *t_locals = nullptr,
                                bool has_this_capture = false) {
        chaiscript::detail::Dispatch_State state(t_ss);

        const Boxed_Value *thisobj = [&]() -> const Boxed_Value * {
          if (auto &stack = t_ss.get_stack_data(state.stack_holder()).back(); !stack.empty() && stack.back().first == "__this") {
            return &stack.back().second;
          } else if (!t_vals.empty()) {
            return &t_vals[0];
          } else {
            return nullptr;
          }
        }();

        chaiscript::eval::detail::Stack_Push_Pop tpp(state);
        if (thisobj && !has_this_capture) {
          state.add_object("this", *thisobj);
        }

        if (t_locals) {
          for (const auto &[name, value] : *t_locals) {
            state.add_object(name, value);
          }
        }

        for (size_t i = 0; i < t_param_names.size(); ++i) {
          if (t_param_names[i] != "this") {
            state.add_object(t_param_names[i], t_vals[i]);
          }
        }

        try {
          return t_node.eval(state);
        } catch (detail::Return_Value &rv) {
          return std::move(rv.retval);
        }
      }